

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uresbund.cpp
# Opt level: O2

UResourceBundle * ures_findResource_63(char *path,UResourceBundle *fillIn,UErrorCode *status)

{
  size_t sVar1;
  char *__dest;
  char *pcVar2;
  UResourceBundle *original;
  char *__s;
  size_t s;
  char *pcVar3;
  
  if ((status != (UErrorCode *)0x0) && (*status < U_ILLEGAL_ARGUMENT_ERROR)) {
    sVar1 = strlen(path);
    s = (size_t)((int)sVar1 + 1);
    __dest = (char *)uprv_malloc_63(s);
    if (__dest == (char *)0x0) {
      *status = U_MEMORY_ALLOCATION_ERROR;
    }
    else {
      memcpy(__dest,path,s);
      pcVar3 = __dest;
      if (*__dest == '/') {
        __s = __dest + 1;
        pcVar2 = strchr(__s,0x2f);
        if (pcVar2 == (char *)0x0) {
          *status = U_ILLEGAL_ARGUMENT_ERROR;
        }
        else {
          *pcVar2 = '\0';
          pcVar3 = pcVar2 + 1;
        }
      }
      else {
        __s = (char *)0x0;
      }
      pcVar2 = strchr(pcVar3,0x2f);
      if (pcVar2 != (char *)0x0) {
        *pcVar2 = '\0';
      }
      original = ures_open_63(__s,pcVar3,status);
      if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
        if (pcVar2 == (char *)0x0) {
          fillIn = ures_copyResb_63(fillIn,original,status);
        }
        else {
          fillIn = ures_findSubResource_63(original,pcVar2 + 1,fillIn,status);
        }
        ures_close_63(original);
      }
      uprv_free_63(__dest);
    }
  }
  return fillIn;
}

Assistant:

U_CAPI UResourceBundle* U_EXPORT2
ures_findResource(const char* path, UResourceBundle *fillIn, UErrorCode *status) 
{
  UResourceBundle *first = NULL; 
  UResourceBundle *result = fillIn;
  char *packageName = NULL;
  char *pathToResource = NULL, *save = NULL;
  char *locale = NULL, *localeEnd = NULL;
  int32_t length;

  if(status == NULL || U_FAILURE(*status)) {
    return result;
  }

  length = (int32_t)(uprv_strlen(path)+1);
  save = pathToResource = (char *)uprv_malloc(length*sizeof(char));
  /* test for NULL */
  if(pathToResource == NULL) {
    *status = U_MEMORY_ALLOCATION_ERROR;
    return result;
  }
  uprv_memcpy(pathToResource, path, length);

  locale = pathToResource;
  if(*pathToResource == RES_PATH_SEPARATOR) { /* there is a path specification */
    pathToResource++;
    packageName = pathToResource;
    pathToResource = uprv_strchr(pathToResource, RES_PATH_SEPARATOR);
    if(pathToResource == NULL) {
      *status = U_ILLEGAL_ARGUMENT_ERROR;
    } else {
      *pathToResource = 0;
      locale = pathToResource+1;
    }
  }

  localeEnd = uprv_strchr(locale, RES_PATH_SEPARATOR);
  if(localeEnd != NULL) {
    *localeEnd = 0;
  }

  first = ures_open(packageName, locale, status);

  if(U_SUCCESS(*status)) {
    if(localeEnd) {
      result = ures_findSubResource(first, localeEnd+1, fillIn, status);
    } else {
      result = ures_copyResb(fillIn, first, status);
    }
    ures_close(first);
  }
  uprv_free(save);
  return result;
}